

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O2

void Wlc_NtkPrintInvStats(Wlc_Ntk_t *pNtk,Vec_Int_t *vCounts,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Wlc_Obj_t *pWVar6;
  char *pcVar7;
  uint uVar8;
  int i;
  
  i = 0;
  iVar4 = 0;
  do {
    if ((pNtk->vCis).nSize <= i) {
      if (vCounts->nSize == iVar4) {
        return;
      }
      __assert_fail("Vec_IntSize(vCounts) == nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcAbc.c"
                    ,0x81,"void Wlc_NtkPrintInvStats(Wlc_Ntk_t *, Vec_Int_t *, int)");
    }
    pWVar6 = Wlc_NtkCi(pNtk,i);
    if ((undefined1  [24])((undefined1  [24])*pWVar6 & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x3) {
      uVar2 = pWVar6->End - pWVar6->Beg;
      uVar1 = -uVar2;
      if (0 < (int)uVar2) {
        uVar1 = uVar2;
      }
      uVar2 = uVar1 + 1;
      for (uVar8 = 0; uVar8 <= uVar1; uVar8 = uVar8 + 1) {
        iVar3 = Vec_IntEntry(vCounts,uVar8 + iVar4);
        if (iVar3 != 0) break;
      }
      if (uVar2 == uVar8) {
        iVar4 = uVar2 + iVar4;
      }
      else {
        pcVar7 = Wlc_ObjName(pNtk,(int)(((long)pWVar6 - (long)pNtk->pObjs) / 0x18));
        printf("%s[%d:%d] : ",pcVar7,(ulong)(uint)pWVar6->End,(ulong)(uint)pWVar6->Beg);
        for (uVar8 = 0; uVar8 <= uVar1; uVar8 = uVar8 + 1) {
          uVar5 = Vec_IntEntry(vCounts,uVar8 + iVar4);
          if (uVar5 != 0) {
            printf("  [%d] -> %d",(ulong)uVar8,(ulong)uVar5);
          }
        }
        putchar(10);
        iVar4 = uVar2 + iVar4;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Wlc_NtkPrintInvStats( Wlc_Ntk_t * pNtk, Vec_Int_t * vCounts, int fVerbose )
{
    Wlc_Obj_t * pObj;
    int i, k, nNum, nRange, nBits = 0;
    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( pObj->Type != WLC_OBJ_FO )
            continue;
        nRange = Wlc_ObjRange(pObj);
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry(vCounts, nBits + k);
            if ( nNum )
                break;
        }
        if ( k == nRange )
        {
            nBits += nRange;
            continue;
        }
        printf( "%s[%d:%d] : ", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), pObj->End, pObj->Beg );
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry( vCounts, nBits + k );
            if ( nNum == 0 )
                continue;
            printf( "  [%d] -> %d", k, nNum );
        }
        printf( "\n");
        nBits += nRange;
    }
    //printf( "%d %d\n", Vec_IntSize(vCounts), nBits );
    assert( Vec_IntSize(vCounts) == nBits );
}